

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intervals.cpp
# Opt level: O0

void __thiscall
IntervalsTest_TestOverlapOuterNested_Test::TestBody(IntervalsTest_TestOverlapOuterNested_Test *this)

{
  allocator<int> *this_00;
  initializer_list<int> __l;
  bool bVar1;
  char *message;
  AssertHelper local_d8;
  Message local_d0;
  vector<int,_std::allocator<int>_> local_c8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar;
  undefined1 local_80 [8];
  vector<int,_std::allocator<int>_> expected;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_34 [3];
  undefined1 local_28 [8];
  vector<wasm::Interval,_std::allocator<wasm::Interval>_> intervals;
  IntervalsTest_TestOverlapOuterNested_Test *this_local;
  
  intervals.super__Vector_base<wasm::Interval,_std::allocator<wasm::Interval>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<wasm::Interval,_std::allocator<wasm::Interval>_>::vector
            ((vector<wasm::Interval,_std::allocator<wasm::Interval>_> *)local_28);
  local_34[2] = 0;
  local_34[1] = 3;
  local_34[0] = 6;
  std::vector<wasm::Interval,std::allocator<wasm::Interval>>::emplace_back<int,int,int>
            ((vector<wasm::Interval,std::allocator<wasm::Interval>> *)local_28,local_34 + 2,
             local_34 + 1,local_34);
  local_48 = 4;
  local_4c = 0xb;
  local_50 = 1;
  std::vector<wasm::Interval,std::allocator<wasm::Interval>>::emplace_back<int,int,int>
            ((vector<wasm::Interval,std::allocator<wasm::Interval>> *)local_28,
             &stack0xffffffffffffffb8,&stack0xffffffffffffffb4,&stack0xffffffffffffffb0);
  local_54 = 0xc;
  local_58 = 0x12;
  local_5c = 3;
  std::vector<wasm::Interval,std::allocator<wasm::Interval>>::emplace_back<int,int,int>
            ((vector<wasm::Interval,std::allocator<wasm::Interval>> *)local_28,
             &stack0xffffffffffffffac,&stack0xffffffffffffffa8,&stack0xffffffffffffffa4);
  local_60 = 2;
  expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0xf;
  expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 6;
  std::vector<wasm::Interval,std::allocator<wasm::Interval>>::emplace_back<int,int,int>
            ((vector<wasm::Interval,std::allocator<wasm::Interval>> *)local_28,
             &stack0xffffffffffffffa0,
             (int *)((long)&expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 4),
             (int *)&expected.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0;
  this_00 = (allocator<int> *)
            ((long)&gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 3);
  std::allocator<int>::allocator(this_00);
  __l._M_len = 3;
  __l._M_array = (iterator)
                 ((long)&gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 + 4);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_80,__l,this_00);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 3));
  ::wasm::IntervalProcessor::filterOverlaps((vector *)&local_c8);
  testing::internal::EqHelper::
  Compare<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_nullptr>
            ((EqHelper *)local_b0,"IntervalProcessor::filterOverlaps(intervals)","expected",
             &local_c8,(vector<int,_std::allocator<int>_> *)local_80);
  std::vector<int,_std::allocator<int>_>::~vector(&local_c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/intervals.cpp"
               ,0x5e,message);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_80);
  std::vector<wasm::Interval,_std::allocator<wasm::Interval>_>::~vector
            ((vector<wasm::Interval,_std::allocator<wasm::Interval>_> *)local_28);
  return;
}

Assistant:

TEST(IntervalsTest, TestOverlapOuterNested) {
  std::vector<Interval> intervals;
  intervals.emplace_back(0, 3, 6);
  intervals.emplace_back(4, 11, 1);
  intervals.emplace_back(12, 18, 3);
  intervals.emplace_back(2, 15, 6);
  std::vector<int> expected{0, 1, 2};
  ASSERT_EQ(IntervalProcessor::filterOverlaps(intervals), expected);
}